

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
gmlc::libguarded::
atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
::load(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
      atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
      *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->m_obj)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_obj)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

T load() const
    {
        std::lock_guard<M> glock(m_mutex);
        return m_obj;
    }